

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O1

void abi_test::internal::
     CheckGTest<void,unsigned_char*,unsigned_char_const*,unsigned_long,unsigned_char_const*,unsigned_long,chacha20_poly1305_seal_data*>
               (char *va_args_str,char *file,int line,bool unwind,
               _func_void_uchar_ptr_uchar_ptr_unsigned_long_uchar_ptr_unsigned_long_chacha20_poly1305_seal_data_ptr
               *func,Type args,Type args_1,Type_conflict args_2,Type args_3,Type_conflict args_4,
               Type args_5)

{
  pointer pbVar1;
  pointer pbVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  pointer pbVar4;
  char *str;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  Message msg;
  Result result;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  string local_88;
  Type_conflict TStack_68;
  Type local_60;
  undefined8 local_58;
  Result local_48;
  
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_string_length = (size_type)args_1;
  local_88.field_2._M_allocated_capacity = args_2;
  local_88.field_2._8_8_ = args_3;
  TStack_68 = args_4;
  local_60 = args_5;
  local_58 = 0;
  local_88._M_dataplus._M_p = (pointer)args;
  RunTrampoline(&local_48,(crypto_word_t)func,(crypto_word_t *)&local_88,6,unwind);
  if (local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),"ABI failures in ",0x10);
    FixVAArgsString_abi_cxx11_(&local_88,(internal *)va_args_str,str);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),local_88._M_dataplus._M_p,
               local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),":\n",2);
    pbVar1 = local_48.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = local_48.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      pbVar1 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pbVar4 = local_48.errors.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pbVar1 != local_48.errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_98._M_head_impl + 0x10),"    ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_98._M_head_impl + 0x10),(pbVar1->_M_dataplus)._M_p,
                 pbVar1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_98._M_head_impl + 0x10),"\n",1);
      pbVar2 = local_48.errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_48.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    local_48.errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    testing::Message::Message((Message *)&local_90);
    _Var3._M_head_impl = local_90._M_head_impl;
    testing::Message::GetString_abi_cxx11_(&local_88,(Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(_Var3._M_head_impl + 0x10),local_88._M_dataplus._M_p,
               local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,file,line,"Failed");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.errors);
  return;
}

Assistant:

inline R CheckGTest(const char *va_args_str, const char *file, int line,
                    bool unwind, R (*func)(Args...),
                    typename DeductionGuard<Args>::Type... args) {
  Result result;
  crypto_word_t ret = CheckImpl(&result, unwind, func, args...);
  if (!result.ok()) {
    testing::Message msg;
    msg << "ABI failures in " << FixVAArgsString(va_args_str) << ":\n";
    for (const auto &error : result.errors) {
      msg << "    " << error << "\n";
    }
    ADD_FAILURE_AT(file, line) << msg;
  }
  return (R)ret;
}